

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O0

AbstractStringSerialiserPrivate * __thiscall
AbstractStringSerialiserPrivate::loadImageVariant
          (AbstractStringSerialiserPrivate *this,int type,QString *val)

{
  QBuffer local_78 [8];
  QBuffer buffer;
  QFlags<QByteArray::Base64Option> local_54;
  QByteArray local_50;
  undefined1 local_38 [8];
  QByteArray byteArray;
  QString *val_local;
  int type_local;
  QImage *imageData;
  
  byteArray.d.size = (qsizetype)val;
  QString::toLatin1(&local_50,val);
  QFlags<QByteArray::Base64Option>::QFlags(&local_54,Base64Encoding);
  QByteArray::fromBase64((QByteArray *)local_38,(QFlags_conflict1 *)&local_50);
  QByteArray::~QByteArray(&local_50);
  QBuffer::QBuffer(local_78,(QByteArray *)local_38,(QObject *)0x0);
  QImage::QImage((QImage *)this);
  QImage::load((QIODevice *)this,(char *)local_78);
  QBuffer::~QBuffer(local_78);
  QByteArray::~QByteArray((QByteArray *)local_38);
  return this;
}

Assistant:

QImage AbstractStringSerialiserPrivate::loadImageVariant(int type, const QString &val)
{
    Q_UNUSED(type)
    QByteArray byteArray = QByteArray::fromBase64(val.toLatin1());
    QBuffer buffer(&byteArray);
    QImage imageData;
    imageData.load(&buffer, "PNG");
    return imageData;
}